

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_iter.c
# Opt level: O1

tnt_iter * tnt_iter_map(tnt_iter *i,char *data,size_t size)

{
  byte bVar1;
  ushort uVar2;
  char *pcVar3;
  byte *pbVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  char **ppcVar8;
  tnt_iter *ptVar9;
  long lVar10;
  bool bVar11;
  char *local_30;
  char *tmp_data;
  
  local_30 = data;
  iVar5 = mp_check(&local_30,data + size);
  if (iVar5 != 0) {
    return (tnt_iter *)0x0;
  }
  if (size == 0 || data == (char *)0x0) {
    return (tnt_iter *)0x0;
  }
  if (mp_type_hint[(byte)*data] != MP_MAP) {
    return (tnt_iter *)0x0;
  }
  bVar11 = i == (tnt_iter *)0x0;
  if (bVar11) {
    ptVar9 = (tnt_iter *)0xa8;
    i = (tnt_iter *)tnt_mem_alloc(0xa8);
    if (i == (tnt_iter *)0x0) {
      i = (tnt_iter *)0x0;
      goto LAB_0010812f;
    }
  }
  ptVar9 = i;
  memset(i,0,0xa8);
  i->alloc = (uint)bVar11;
LAB_0010812f:
  if (i == (tnt_iter *)0x0) {
    return (tnt_iter *)0x0;
  }
  i->type = TNT_ITER_MAP;
  i->next = tnt_iter_map_next;
  i->rewind = tnt_iter_map_rewind;
  i->free = (_func_void_tnt_iter_ptr *)0x0;
  (i->data).array.data = data;
  (i->data).array.first_elem = data;
  bVar1 = *data;
  (i->data).array.first_elem = data + 1;
  if (bVar1 == 0xdf) {
    uVar6 = *(uint *)(data + 1);
    uVar6 = uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
    (i->data).array.first_elem = data + 5;
  }
  else if (bVar1 == 0xde) {
    uVar2 = *(ushort *)(data + 1);
    (i->data).array.first_elem = data + 3;
    uVar6 = (uint)(ushort)(uVar2 << 8 | uVar2 >> 8);
  }
  else {
    if (-0x71 < (char)bVar1) {
      tnt_iter_map_cold_1();
      uVar6 = (ptVar9->data).map.cur_index + 1;
      (ptVar9->data).map.cur_index = uVar6;
      if (uVar6 < (ptVar9->data).map.pair_count) {
        pcVar3 = *(char **)((long)&ptVar9->data + (ulong)(uVar6 != 0) * 0x20 + 8);
        (ptVar9->data).array.elem = pcVar3;
        ppcVar8 = &(ptVar9->data).array.elem_end;
        (ptVar9->data).array.elem_end = pcVar3;
        lVar10 = 1;
        do {
          pbVar4 = (byte *)*ppcVar8;
          bVar1 = *pbVar4;
          *ppcVar8 = (char *)(pbVar4 + 1);
          lVar7 = (long)""[bVar1];
          if (lVar7 < 0) {
            if (bVar1 == 0xd9) {
              *ppcVar8 = (char *)(pbVar4 + (ulong)pbVar4[1] + 2);
              goto LAB_00108235;
            }
            if (-0x20 < ""[bVar1]) {
              lVar10 = lVar10 - lVar7;
              goto LAB_00108235;
            }
            *ppcVar8 = (char *)pbVar4;
            mp_next_slowpath(ppcVar8,lVar10);
            bVar11 = false;
            lVar7 = lVar10;
          }
          else {
            *ppcVar8 = (char *)(pbVar4 + 1 + lVar7);
LAB_00108235:
            bVar11 = true;
            lVar7 = lVar10;
          }
        } while ((bVar11) && (lVar10 = lVar7 + -1, 1 < lVar7));
        pcVar3 = (ptVar9->data).array.elem_end;
        (ptVar9->data).map.value = pcVar3;
        (ptVar9->data).map.value_end = pcVar3;
        ppcVar8 = &(ptVar9->data).map.value_end;
        lVar10 = 1;
        do {
          pbVar4 = (byte *)*ppcVar8;
          bVar1 = *pbVar4;
          *ppcVar8 = (char *)(pbVar4 + 1);
          lVar7 = (long)""[bVar1];
          if (lVar7 < 0) {
            if (bVar1 == 0xd9) {
              *ppcVar8 = (char *)(pbVar4 + (ulong)pbVar4[1] + 2);
              goto LAB_001082c0;
            }
            if (-0x20 < ""[bVar1]) {
              lVar10 = lVar10 - lVar7;
              goto LAB_001082c0;
            }
            *ppcVar8 = (char *)pbVar4;
            mp_next_slowpath(ppcVar8,lVar10);
            bVar11 = false;
            lVar7 = lVar10;
          }
          else {
            *ppcVar8 = (char *)(pbVar4 + 1 + lVar7);
LAB_001082c0:
            bVar11 = true;
            lVar7 = lVar10;
          }
          ptVar9 = (tnt_iter *)0x1;
        } while ((bVar11) && (lVar10 = lVar7 + -1, 1 < lVar7));
      }
      else {
        ptVar9->status = TNT_ITER_FAIL;
        ptVar9 = (tnt_iter *)0x0;
      }
      return ptVar9;
    }
    uVar6 = bVar1 & 0xf;
  }
  *(uint *)((long)&i->data + 0x30) = uVar6;
  (i->data).map.cur_index = -1;
  return i;
}

Assistant:

struct tnt_iter *
tnt_iter_map(struct tnt_iter *i, const char *data, size_t size)
{
	const char *tmp_data = data;
	if (mp_check(&tmp_data, data + size) != 0)
		return NULL;
	if (!data || !size || mp_typeof(*data) != MP_MAP)
		return NULL;
	i = tnt_iter_init(i);
	if (i == NULL)
		return NULL;
	i->type = TNT_ITER_MAP;
	i->next = tnt_iter_map_next;
	i->rewind = tnt_iter_map_rewind;
	i->free = NULL;
	struct tnt_iter_map *itr = TNT_IMAP(i);
	itr->data = data;
	itr->first_key = data;
	itr->pair_count = mp_decode_map(&itr->first_key);
	itr->cur_index = -1;
	return i;
}